

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::receivefile(int sender,uchar *data,int len)

{
  clientinfo *ci_00;
  char *pcVar1;
  clientinfo *ci;
  int len_local;
  uchar *data_local;
  int sender_local;
  
  ci_00 = getinfo(sender);
  if (((((-4 < gamemode) && (gamemode < 0x17)) && ((gamemodes[gamemode + 3].flags & 0x1000U) != 0))
      && ((0 < len && (len < 0x400001)))) &&
     (((instacoop == 0 || (ci_00->privilege == 3)) &&
      ((((ci_00->state).state != 5 || (ci_00->privilege != 0)) || ((ci_00->local & 1U) != 0)))))) {
    if ((mapdata != (stream *)0x0) && (mapdata != (stream *)0x0)) {
      if (mapdata != (stream *)0x0) {
        (*mapdata->_vptr_stream[1])();
      }
      mapdata = (stream *)0x0;
    }
    mapdata = opentempfile("mapdata","w+b");
    if (mapdata == (stream *)0x0) {
      sendf(sender,1,"ris",0x23,"\f3Error: Failed to open temporary file for map");
    }
    else {
      (*mapdata->_vptr_stream[10])(mapdata,data,(ulong)(uint)len);
      pcVar1 = colorname(ci_00);
      sendservmsgf("\f0%s \f7uploaded a map to the server, type \f2\"/getmap\" \f7to receive it",
                   pcVar1);
    }
  }
  return;
}

Assistant:

void receivefile(int sender, uchar *data, int len)
    {
        clientinfo *ci = getinfo(sender);
        if(!m_edit || len <= 0 || len > 4*1024*1024 || (instacoop && ci->privilege != PRIV_ADMIN)) return; //ignore empty sendmaps/instacoop w/o admin
        if(ci->state.state==CS_SPECTATOR && !ci->privilege && !ci->local) return;
        if(mapdata) DELETEP(mapdata);
        mapdata = opentempfile("mapdata", "w+b");
        if(!mapdata) {sendf(sender, 1, "ris", N_SERVMSG, "\f3Error: Failed to open temporary file for map"); return;}
        mapdata->write(data, len);
        sendservmsgf("\f0%s \f7uploaded a map to the server, type \f2\"/getmap\" \f7to receive it", colorname(ci));
    }